

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_unpause(Curl_easy *data)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  
  pCVar1 = (data->req).reader_stack;
  while ((CVar2 = CURLE_OK, pCVar1 != (Curl_creader *)0x0 &&
         (CVar2 = (*pCVar1->crt->unpause)(data,pCVar1), CVar2 == CURLE_OK))) {
    pCVar1 = pCVar1->next;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_creader_unpause(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  CURLcode result = CURLE_OK;

  while(reader) {
    result = reader->crt->unpause(data, reader);
    if(result)
      break;
    reader = reader->next;
  }
  return result;
}